

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  bool bVar1;
  unsigned_short local_632;
  uint local_630;
  bool local_62b;
  unsigned_short local_62a;
  uint local_628;
  bool _kj_shouldLog_18;
  DebugExpression<unsigned_int> DStack_624;
  undefined1 local_620 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_22;
  ListElementCount local_5f8;
  uint j;
  Fault local_5f0;
  Fault f_3;
  uint local_5e0;
  DebugExpression<unsigned_int> local_5dc;
  undefined1 local_5d8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_21;
  undefined1 local_598 [8];
  ListReader element_1;
  ListElementCount local_560;
  uint i_1;
  Fault local_558;
  Fault f_2;
  uint local_548;
  DebugExpression<unsigned_int> local_544;
  undefined1 local_540 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_20;
  undefined1 local_500 [8];
  ListReader list_2;
  StructReader local_4b0;
  int local_47c;
  int local_478;
  bool local_471;
  undefined1 local_470 [7];
  bool _kj_shouldLog_17;
  StructReader local_450;
  int local_41c;
  int local_418;
  DebugExpression<int> local_414;
  undefined1 local_410 [8];
  DebugComparison<int,_int> _kjCondition_19;
  bool local_3e5;
  int local_3e4;
  int iStack_3e0;
  bool _kj_shouldLog_16;
  DebugExpression<int> local_3dc;
  undefined1 local_3d8 [8];
  DebugComparison<int,_int> _kjCondition_18;
  StructReader element;
  ListElementCount local_380;
  int i;
  Fault local_378;
  Fault f_1;
  uint local_368;
  DebugExpression<unsigned_int> local_364;
  undefined1 local_360 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_17;
  undefined1 local_320 [8];
  ListReader list_1;
  bool local_2e5;
  int local_2e4;
  int iStack_2e0;
  bool _kj_shouldLog_15;
  DebugExpression<int> local_2dc;
  undefined1 local_2d8 [8];
  DebugComparison<int,_int> _kjCondition_16;
  bool local_2ad;
  int local_2ac;
  int iStack_2a8;
  bool _kj_shouldLog_14;
  DebugExpression<int> local_2a4;
  undefined1 local_2a0 [8];
  DebugComparison<int,_int> _kjCondition_15;
  bool local_275;
  int local_274;
  int iStack_270;
  bool _kj_shouldLog_13;
  DebugExpression<int> local_26c;
  undefined1 local_268 [8];
  DebugComparison<int,_int> _kjCondition_14;
  ListElementCount local_238;
  uint local_234;
  Fault local_230;
  Fault f;
  uint local_220;
  DebugExpression<unsigned_int> local_21c;
  undefined1 local_218 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_13;
  undefined1 local_1d8 [8];
  ListReader list;
  bool local_19d;
  uint local_19c;
  uint uStack_198;
  bool _kj_shouldLog_12;
  DebugExpression<unsigned_int> local_194;
  undefined1 local_190 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_12;
  undefined1 local_150 [8];
  StructReader subStruct;
  bool local_118;
  DebugExpression<bool> local_117;
  bool local_116;
  bool local_115;
  DebugExpression<bool> local_114;
  bool local_113;
  bool local_112;
  bool _kj_shouldLog_11;
  bool local_110;
  DebugExpression<bool> _kjCondition_11;
  bool _kj_shouldLog_10;
  bool local_10d;
  DebugExpression<bool> _kjCondition_10;
  bool _kj_shouldLog_9;
  bool local_10a;
  DebugExpression<bool> _kjCondition_9;
  bool _kj_shouldLog_8;
  bool local_107;
  DebugExpression<bool> _kjCondition_8;
  bool _kj_shouldLog_7;
  bool local_104;
  DebugExpression<bool> _kjCondition_7;
  bool _kj_shouldLog_6;
  uchar local_101;
  DebugExpression<bool> _kjCondition_6;
  bool _kj_shouldLog_5;
  DebugExpression<bool> _kjCondition_5;
  bool _kj_shouldLog_4;
  DebugExpression<bool> _kjCondition_4;
  uchar local_f9;
  uint local_f8;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_int> DStack_f4;
  undefined1 local_f0 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_3;
  uint local_c8;
  bool local_c3;
  unsigned_short local_c2;
  uint local_c0;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int> DStack_bc;
  undefined1 local_b8 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_2;
  bool local_8d;
  uint local_8c;
  uint uStack_88;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_int> local_84;
  undefined1 local_80 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  unsigned_long_long local_58;
  bool local_49;
  unsigned_long uStack_48;
  bool _kj_shouldLog;
  unsigned_long_long local_40;
  DebugExpression<unsigned_long_long> local_38;
  undefined1 local_30 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition;
  
  local_40 = 0x1011121314151617;
  local_38 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_40);
  uStack_48 = StructReader::getDataField<unsigned_long>((StructReader *)&stack0x00000008,0);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_30,&local_38,
             &stack0xffffffffffffffb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_58 = 0x1011121314151617;
      _kjCondition_1._24_8_ =
           StructReader::getDataField<unsigned_long>((StructReader *)&stack0x00000008,0);
      kj::_::Debug::
      log<char_const(&)[90],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", _kjCondition, 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,(DebugComparison<unsigned_long_long,_unsigned_long> *)local_30,&local_58,
                 (unsigned_long *)&_kjCondition_1.result);
      local_49 = false;
    }
  }
  uStack_88 = 0x20212223;
  local_84 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff78);
  local_8c = StructReader::getDataField<unsigned_int>((StructReader *)&stack0x00000008,2);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_80,&local_84,&local_8c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar1) {
    local_8d = kj::_::Debug::shouldLog(ERROR);
    while (local_8d != false) {
      _kjCondition_2._28_4_ = 0x20212223;
      _kjCondition_2._24_4_ =
           StructReader::getDataField<unsigned_int>((StructReader *)&stack0x00000008,2);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", _kjCondition, 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_80,
                 (uint *)&_kjCondition_2.field_0x1c,(uint *)&_kjCondition_2.result);
      local_8d = false;
    }
  }
  local_c0 = 0x3031;
  DStack_bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
  local_c2 = StructReader::getDataField<unsigned_short>((StructReader *)&stack0x00000008,6);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_b8,&stack0xffffffffffffff44,
             &local_c2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    local_c3 = kj::_::Debug::shouldLog(ERROR);
    while (local_c3 != false) {
      local_c8 = 0x3031;
      _kjCondition_3._30_2_ =
           StructReader::getDataField<unsigned_short>((StructReader *)&stack0x00000008,6);
      kj::_::Debug::
      log<char_const(&)[76],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", _kjCondition, 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_b8,&local_c8,
                 (unsigned_short *)&_kjCondition_3.field_0x1e);
      local_c3 = false;
    }
  }
  local_f8 = 0x40;
  DStack_f4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f8);
  local_f9 = StructReader::getDataField<unsigned_char>((StructReader *)&stack0x00000008,0xe);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_f0,&stack0xffffffffffffff0c,
             &local_f9);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
  if (!bVar1) {
    _kjCondition_4.value = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4.value != false) {
      __kjCondition_6 = 0x40;
      local_101 = StructReader::getDataField<unsigned_char>((StructReader *)&stack0x00000008,0xe);
      kj::_::Debug::
      log<char_const(&)[74],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", _kjCondition, 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
                 ,(char (*) [74])
                  "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_f0,(uint *)&_kjCondition_6,
                 &local_101);
      _kjCondition_4.value = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x78);
  _kjCondition_7.value = (bool)((bVar1 ^ 0xffU) & 1);
  _kj_shouldLog_6 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_7.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_6);
  if (!bVar1) {
    local_104 = kj::_::Debug::shouldLog(ERROR);
    while (local_104 != false) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kj_shouldLog_6);
      local_104 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x79);
  _kjCondition_8.value = (bool)((bVar1 ^ 0xffU) & 1);
  _kj_shouldLog_7 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_8.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_7);
  if (!bVar1) {
    local_107 = kj::_::Debug::shouldLog(ERROR);
    while (local_107 != false) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kj_shouldLog_7);
      local_107 = false;
    }
  }
  _kjCondition_9.value = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7a);
  _kj_shouldLog_8 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_9.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_8);
  if (!bVar1) {
    local_10a = kj::_::Debug::shouldLog(ERROR);
    while (local_10a != false) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)",
                 (DebugExpression<bool> *)&_kj_shouldLog_8);
      local_10a = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7b);
  _kjCondition_10.value = (bool)((bVar1 ^ 0xffU) & 1);
  _kj_shouldLog_9 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_10.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_9);
  if (!bVar1) {
    local_10d = kj::_::Debug::shouldLog(ERROR);
    while (local_10d != false) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kj_shouldLog_9);
      local_10d = false;
    }
  }
  _kjCondition_11.value = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7c);
  _kj_shouldLog_10 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_11.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_10);
  if (!bVar1) {
    local_110 = kj::_::Debug::shouldLog(ERROR);
    while (local_110 != false) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)",
                 (DebugExpression<bool> *)&_kj_shouldLog_10);
      local_110 = false;
    }
  }
  local_112 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7d);
  _kj_shouldLog_11 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_112);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_11);
  if (!bVar1) {
    local_113 = kj::_::Debug::shouldLog(ERROR);
    while (local_113 != false) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)",
                 (DebugExpression<bool> *)&_kj_shouldLog_11);
      local_113 = false;
    }
  }
  local_115 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7e);
  local_114 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_115);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_114);
  if (!bVar1) {
    local_116 = kj::_::Debug::shouldLog(ERROR);
    while (local_116 != false) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)",
                 &local_114);
      local_116 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7f);
  local_118 = (bool)((bVar1 ^ 0xffU) & 1);
  local_117 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_118);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_117);
  if (!bVar1) {
    subStruct._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (subStruct._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))",
                 &local_117);
      subStruct._47_1_ = 0;
    }
  }
  StructReader::getPointerField
            ((PointerReader *)&_kjCondition_12.result,(StructReader *)&stack0x00000008,0);
  PointerReader::getStruct
            ((StructReader *)local_150,(PointerReader *)&_kjCondition_12.result,
             (word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  uStack_198 = 0x7b;
  local_194 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe68);
  local_19c = StructReader::getDataField<unsigned_int>((StructReader *)local_150,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_190,&local_194,&local_19c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_19d = kj::_::Debug::shouldLog(ERROR);
    while (local_19d != false) {
      list._44_4_ = 0x7b;
      list.nestingLimit = StructReader::getDataField<unsigned_int>((StructReader *)local_150,0);
      kj::_::Debug::
      log<char_const(&)[76],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xfa,ERROR,
                 "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", _kjCondition, 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_190,(uint *)&list.field_0x2c,
                 (uint *)&list.nestingLimit);
      local_19d = false;
    }
  }
  StructReader::getPointerField
            ((PointerReader *)&_kjCondition_13.result,(StructReader *)&stack0x00000008,1);
  PointerReader::getList
            ((ListReader *)local_1d8,(PointerReader *)&_kjCondition_13.result,FOUR_BYTES,(word *)0x0
            );
  local_220 = 3;
  local_21c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_220);
  f.exception._4_4_ = ListReader::size((ListReader *)local_1d8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_218,&local_21c,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
  if (!bVar1) {
    local_234 = 3;
    local_238 = ListReader::size((ListReader *)local_1d8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())",
               "_kjCondition,3 * ELEMENTS, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_218,&local_234,&local_238);
    kj::_::Debug::Fault::fatal(&local_230);
  }
  iStack_270 = 200;
  local_26c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd90);
  local_274 = ListReader::getDataElement<int>((ListReader *)local_1d8,0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_268,&local_26c,&local_274);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_268);
  if (!bVar1) {
    local_275 = kj::_::Debug::shouldLog(ERROR);
    while (local_275 != false) {
      _kjCondition_15._28_4_ = 200;
      _kjCondition_15._24_4_ = ListReader::getDataElement<int>((ListReader *)local_1d8,0);
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x100,ERROR,
                 "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", _kjCondition, 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",
                 (DebugComparison<int,_int> *)local_268,(int *)&_kjCondition_15.field_0x1c,
                 (int *)&_kjCondition_15.result);
      local_275 = false;
    }
  }
  iStack_2a8 = 0xc9;
  local_2a4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd58);
  local_2ac = ListReader::getDataElement<int>((ListReader *)local_1d8,1);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_2a0,&local_2a4,&local_2ac);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
  if (!bVar1) {
    local_2ad = kj::_::Debug::shouldLog(ERROR);
    while (local_2ad != false) {
      _kjCondition_16._28_4_ = 0xc9;
      _kjCondition_16._24_4_ = ListReader::getDataElement<int>((ListReader *)local_1d8,1);
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x101,ERROR,
                 "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", _kjCondition, 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",
                 (DebugComparison<int,_int> *)local_2a0,(int *)&_kjCondition_16.field_0x1c,
                 (int *)&_kjCondition_16.result);
      local_2ad = false;
    }
  }
  iStack_2e0 = 0xca;
  local_2dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd20);
  local_2e4 = ListReader::getDataElement<int>((ListReader *)local_1d8,2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_2d8,&local_2dc,&local_2e4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d8);
  if (!bVar1) {
    local_2e5 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e5 != false) {
      list_1._44_4_ = 0xca;
      list_1.nestingLimit = ListReader::getDataElement<int>((ListReader *)local_1d8,2);
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x102,ERROR,
                 "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", _kjCondition, 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",
                 (DebugComparison<int,_int> *)local_2d8,(int *)&list_1.field_0x2c,
                 &list_1.nestingLimit);
      local_2e5 = false;
    }
  }
  StructReader::getPointerField
            ((PointerReader *)&_kjCondition_17.result,(StructReader *)&stack0x00000008,2);
  PointerReader::getList
            ((ListReader *)local_320,(PointerReader *)&_kjCondition_17.result,INLINE_COMPOSITE,
             (word *)0x0);
  local_368 = 4;
  local_364 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_368);
  f_1.exception._4_4_ = ListReader::size((ListReader *)local_320);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_360,&local_364,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (bVar1) {
    for (element._44_4_ = 0; (int)element._44_4_ < 4; element._44_4_ = element._44_4_ + 1) {
      ListReader::getStructElement
                ((StructReader *)&_kjCondition_18.result,(ListReader *)local_320,element._44_4_);
      iStack_3e0 = element._44_4_ + 300;
      local_3dc = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc20);
      local_3e4 = StructReader::getDataField<int>((StructReader *)&_kjCondition_18.result,0);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_3d8,&local_3dc,&local_3e4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d8);
      if (!bVar1) {
        local_3e5 = kj::_::Debug::shouldLog(ERROR);
        while (local_3e5 != false) {
          _kjCondition_19._28_4_ = element._44_4_ + 300;
          _kjCondition_19._24_4_ =
               StructReader::getDataField<int>((StructReader *)&_kjCondition_18.result,0);
          kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<int,int>&,int,int>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x10b,ERROR,
                     "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", _kjCondition, 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                     ,(char (*) [76])
                      "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                     (DebugComparison<int,_int> *)local_3d8,(int *)&_kjCondition_19.field_0x1c,
                     (int *)&_kjCondition_19.result);
          local_3e5 = false;
        }
      }
      local_418 = element._44_4_ + 400;
      local_414 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_418);
      StructReader::getPointerField
                ((PointerReader *)local_470,(StructReader *)&_kjCondition_18.result,0);
      PointerReader::getStruct
                (&local_450,(PointerReader *)local_470,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      local_41c = StructReader::getDataField<int>(&local_450,0);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_410,&local_414,&local_41c);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_410);
      if (!bVar1) {
        local_471 = kj::_::Debug::shouldLog(ERROR);
        while (local_471 != false) {
          local_478 = element._44_4_ + 400;
          StructReader::getPointerField
                    ((PointerReader *)&list_2.nestingLimit,(StructReader *)&_kjCondition_18.result,0
                    );
          PointerReader::getStruct
                    (&local_4b0,(PointerReader *)&list_2.nestingLimit,
                     (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
          local_47c = StructReader::getDataField<int>(&local_4b0,0);
          kj::_::Debug::log<char_const(&)[162],kj::_::DebugComparison<int,int>&,int,int>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x10f,ERROR,
                     "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", _kjCondition, 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                     ,(char (*) [162])
                      "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                     ,(DebugComparison<int,_int> *)local_410,&local_478,&local_47c);
          local_471 = false;
        }
      }
    }
    StructReader::getPointerField
              ((PointerReader *)&_kjCondition_20.result,(StructReader *)&stack0x00000008,3);
    PointerReader::getList
              ((ListReader *)local_500,(PointerReader *)&_kjCondition_20.result,POINTER,(word *)0x0)
    ;
    local_548 = 5;
    local_544 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_548);
    f_2.exception._4_4_ = ListReader::size((ListReader *)local_500);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_540,&local_544,
               (uint *)((long)&f_2.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_540);
    if (bVar1) {
      element_1._44_4_ = 0;
      while( true ) {
        if (4 < (uint)element_1._44_4_) {
          return;
        }
        ListReader::getPointerElement
                  ((PointerReader *)&_kjCondition_21.result,(ListReader *)local_500,element_1._44_4_
                  );
        PointerReader::getList
                  ((ListReader *)local_598,(PointerReader *)&_kjCondition_21.result,TWO_BYTES,
                   (word *)0x0);
        local_5e0 = element_1._44_4_ + 1;
        local_5dc = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5e0);
        f_3.exception._4_4_ = ListReader::size((ListReader *)local_598);
        kj::_::DebugExpression<unsigned_int>::operator==
                  ((DebugComparison<unsigned_int,_unsigned_int> *)local_5d8,&local_5dc,
                   (uint *)((long)&f_3.exception + 4));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5d8);
        if (!bVar1) break;
        for (_kjCondition_22._28_4_ = 0; (uint)_kjCondition_22._28_4_ <= (uint)element_1._44_4_;
            _kjCondition_22._28_4_ = _kjCondition_22._28_4_ + 1) {
          local_628 = _kjCondition_22._28_4_ + 500;
          DStack_624 = kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_628);
          local_62a = ListReader::getDataElement<unsigned_short>
                                ((ListReader *)local_598,_kjCondition_22._28_4_);
          kj::_::DebugExpression<unsigned_int>::operator==
                    ((DebugComparison<unsigned_int,_unsigned_short> *)local_620,
                     &stack0xfffffffffffff9dc,&local_62a);
          bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_620);
          if (!bVar1) {
            local_62b = kj::_::Debug::shouldLog(ERROR);
            while (local_62b != false) {
              local_630 = _kjCondition_22._28_4_ + 500;
              local_632 = ListReader::getDataElement<unsigned_short>
                                    ((ListReader *)local_598,_kjCondition_22._28_4_);
              kj::_::Debug::
              log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                        ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                         ,0x11b,ERROR,
                         "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", _kjCondition, 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                         ,(char (*) [80])
                          "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                         ,(DebugComparison<unsigned_int,_unsigned_short> *)local_620,&local_630,
                         &local_632);
              local_62b = false;
            }
          }
        }
        element_1._44_4_ = element_1._44_4_ + 1;
      }
      j = element_1._44_4_ + 1;
      local_5f8 = ListReader::size((ListReader *)local_598);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&local_5f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
                 "_kjCondition,(i + 1) * ELEMENTS, element.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_5d8,&j,&local_5f8);
      kj::_::Debug::Fault::fatal(&local_5f0);
    }
    i_1 = 5;
    local_560 = ListReader::size((ListReader *)local_500);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())",
               "_kjCondition,5 * ELEMENTS, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_540,&i_1,&local_560);
    kj::_::Debug::Fault::fatal(&local_558);
  }
  i = 4;
  local_380 = ListReader::size((ListReader *)local_320);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_378,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())",
             "_kjCondition,4 * ELEMENTS, list.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_360,(uint *)&i,&local_380);
  kj::_::Debug::Fault::fatal(&local_378);
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}